

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.c
# Opt level: O2

int mp_fprint_ext_default(FILE *file,char **data,int depth)

{
  int iVar1;
  int8_t type;
  uint32_t len;
  char local_1d;
  uint local_1c;
  
  mp_decode_ext(data,&local_1d,&local_1c);
  iVar1 = fprintf((FILE *)file,"(extension: type %d, len %u)",(ulong)(uint)(int)local_1d,
                  (ulong)local_1c);
  return iVar1;
}

Assistant:

int
mp_fprint_ext_default(FILE *file, const char **data, int depth)
{
	(void) depth;
	int8_t type;
	uint32_t len;
	mp_decode_ext(data, &type, &len);
	return fprintf(file, "(extension: type %d, len %u)", (int)type,
		      (unsigned)len);
}